

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O0

void unbiasnet(nn_quant *nnq)

{
  int local_1c;
  int local_18;
  int temp;
  int j;
  int i;
  nn_quant *nnq_local;
  
  for (temp = 0; temp < nnq->netsize; temp = temp + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      local_1c = nnq->network[temp][local_18] + 8 >> 4;
      if (0xff < local_1c) {
        local_1c = 0xff;
      }
      nnq->network[temp][local_18] = local_1c;
    }
    nnq->network[temp][4] = temp;
  }
  return;
}

Assistant:

void unbiasnet(nn_quant *nnq)
{
	int i,j,temp;

	for (i=0; i < nnq->netsize; i++) {
		for (j=0; j<4; j++) {
			/* OLD CODE: network[i][j] >>= netbiasshift; */
			/* Fix based on bug report by Juergen Weigert jw@suse.de */
			temp = (nnq->network[i][j] + (1 << (netbiasshift - 1))) >> netbiasshift;
			if (temp > 255) temp = 255;
			nnq->network[i][j] = temp;
		}
		nnq->network[i][4] = i;			/* record colour no */
	}
}